

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCompareMemString(Mem *pMem1,Mem *pMem2,CollSeq *pColl,u8 *prcErr)

{
  undefined1 *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Mem c2;
  Mem c1;
  void *v2;
  void *v1;
  int rc;
  sqlite3_value *in_stack_ffffffffffffff48;
  MemValue in_stack_ffffffffffffff50;
  int local_a4;
  Mem local_78;
  void *local_40;
  void *local_38;
  int local_2c;
  undefined1 *local_28;
  long local_20;
  long local_10;
  int local_4;
  
  if (*(char *)(in_RDI + 10) == *(char *)(in_RDX + 8)) {
    local_4 = (**(code **)(in_RDX + 0x18))
                        (*(undefined8 *)(in_RDX + 0x10),*(undefined4 *)(in_RDI + 0xc),
                         *(undefined8 *)(in_RDI + 0x10),*(undefined4 *)(in_RSI + 0xc),
                         *(undefined8 *)(in_RSI + 0x10));
  }
  else {
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_10 = in_RDI;
    sqlite3VdbeMemInit(&local_78,*(sqlite3 **)(in_RDI + 0x28),1);
    sqlite3VdbeMemInit((Mem *)&stack0xffffffffffffff50,*(sqlite3 **)(local_10 + 0x28),1);
    sqlite3VdbeMemShallowCopy((Mem *)in_stack_ffffffffffffff50.pDef,in_stack_ffffffffffffff48,0);
    sqlite3VdbeMemShallowCopy((Mem *)in_stack_ffffffffffffff50.pDef,in_stack_ffffffffffffff48,0);
    local_38 = sqlite3ValueText(in_stack_ffffffffffffff48,'\0');
    local_40 = sqlite3ValueText(in_stack_ffffffffffffff48,'\0');
    if ((local_38 == (void *)0x0) || (local_40 == (void *)0x0)) {
      if (local_28 != (undefined1 *)0x0) {
        *local_28 = 7;
      }
      local_2c = 0;
    }
    else {
      local_2c = (**(code **)(local_20 + 0x18))
                           (*(undefined8 *)(local_20 + 0x10),local_78.n,local_38,local_a4,local_40);
    }
    sqlite3VdbeMemRelease((Mem *)0x16e46a);
    sqlite3VdbeMemRelease((Mem *)0x16e474);
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

static int vdbeCompareMemString(
  const Mem *pMem1,
  const Mem *pMem2,
  const CollSeq *pColl,
  u8 *prcErr                      /* If an OOM occurs, set to SQLITE_NOMEM */
){
  if( pMem1->enc==pColl->enc ){
    /* The strings are already in the correct encoding.  Call the
     ** comparison function directly */
    return pColl->xCmp(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
  }else{
    int rc;
    const void *v1, *v2;
    Mem c1;
    Mem c2;
    sqlite3VdbeMemInit(&c1, pMem1->db, MEM_Null);
    sqlite3VdbeMemInit(&c2, pMem1->db, MEM_Null);
    sqlite3VdbeMemShallowCopy(&c1, pMem1, MEM_Ephem);
    sqlite3VdbeMemShallowCopy(&c2, pMem2, MEM_Ephem);
    v1 = sqlite3ValueText((sqlite3_value*)&c1, pColl->enc);
    v2 = sqlite3ValueText((sqlite3_value*)&c2, pColl->enc);
    if( (v1==0 || v2==0) ){
      if( prcErr ) *prcErr = SQLITE_NOMEM_BKPT;
      rc = 0;
    }else{
      rc = pColl->xCmp(pColl->pUser, c1.n, v1, c2.n, v2);
    }
    sqlite3VdbeMemRelease(&c1);
    sqlite3VdbeMemRelease(&c2);
    return rc;
  }
}